

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_arithmetic.c
# Opt level: O1

void binop1_pow_bang(t_binop *x)

{
  float __x;
  float fVar1;
  float f;
  
  __x = x->x_f1;
  f = 0.0;
  if (((__x != 0.0) || (NAN(__x))) || (0.0 < x->x_f2 || x->x_f2 == 0.0)) {
    if (__x < 0.0) {
      fVar1 = x->x_f2;
      f = 0.0;
      if ((fVar1 != (float)(int)fVar1) || (NAN(fVar1) || NAN((float)(int)fVar1))) goto LAB_0017a7a7;
    }
    f = powf(__x,x->x_f2);
  }
LAB_0017a7a7:
  outlet_float((x->x_obj).te_outlet,f);
  return;
}

Assistant:

static void binop1_pow_bang(t_binop *x)
{
    t_float r = (x->x_f1 == 0 && x->x_f2 < 0) ||
        (x->x_f1 < 0 && (x->x_f2 - (int)x->x_f2) != 0) ?
            0 : POW(x->x_f1, x->x_f2);
    outlet_float(x->x_obj.ob_outlet, r);
}